

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_altsvc_received(nghttp2_session *session,nghttp2_frame *frame)

{
  long lVar1;
  long lVar2;
  int iVar3;
  nghttp2_session *in_RSI;
  nghttp2_stream *stream;
  nghttp2_ext_altsvc *altsvc;
  nghttp2_stream *in_stack_ffffffffffffffd8;
  nghttp2_frame *frame_00;
  int local_4;
  
  frame_00 = (nghttp2_frame *)(in_RSI->streams).size;
  iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (*(int *)&(in_RSI->streams).mem == 0) {
    lVar1._0_4_ = ((nghttp2_frame_hd *)frame_00)->stream_id;
    lVar1._4_1_ = ((nghttp2_frame_hd *)frame_00)->type;
    lVar1._5_1_ = ((nghttp2_frame_hd *)frame_00)->flags;
    lVar1._6_1_ = ((nghttp2_frame_hd *)frame_00)->reserved;
    lVar1._7_1_ = ((nghttp2_frame_hd *)frame_00)->field_0xf;
    if (lVar1 == 0) {
      iVar3 = session_call_on_invalid_frame_recv_callback(in_RSI,frame_00,iVar3);
      return iVar3;
    }
  }
  else {
    lVar2._0_4_ = ((nghttp2_frame_hd *)frame_00)->stream_id;
    lVar2._4_1_ = ((nghttp2_frame_hd *)frame_00)->type;
    lVar2._5_1_ = ((nghttp2_frame_hd *)frame_00)->flags;
    lVar2._6_1_ = ((nghttp2_frame_hd *)frame_00)->reserved;
    lVar2._7_1_ = ((nghttp2_frame_hd *)frame_00)->field_0xf;
    if (lVar2 != 0) {
      iVar3 = session_call_on_invalid_frame_recv_callback(in_RSI,frame_00,iVar3);
      return iVar3;
    }
    in_stack_ffffffffffffffd8 =
         nghttp2_session_get_stream(in_RSI,(int32_t)((ulong)frame_00 >> 0x20));
    if (in_stack_ffffffffffffffd8 == (nghttp2_stream *)0x0) {
      return 0;
    }
    if (in_stack_ffffffffffffffd8->state == NGHTTP2_STREAM_CLOSING) {
      return 0;
    }
  }
  if ((frame_00->settings).iv == (nghttp2_settings_entry *)0x0) {
    local_4 = session_call_on_invalid_frame_recv_callback
                        (in_RSI,frame_00,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  else {
    local_4 = session_call_on_frame_received(in_RSI,frame_00);
  }
  return local_4;
}

Assistant:

int nghttp2_session_on_altsvc_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  nghttp2_ext_altsvc *altsvc;
  nghttp2_stream *stream;

  altsvc = frame->ext.payload;

  /* session->server case has been excluded */

  if (frame->hd.stream_id == 0) {
    if (altsvc->origin_len == 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }
  } else {
    if (altsvc->origin_len > 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return 0;
    }
  }

  if (altsvc->field_value_len == 0) {
    return session_call_on_invalid_frame_recv_callback(session, frame,
                                                       NGHTTP2_ERR_PROTO);
  }

  return session_call_on_frame_received(session, frame);
}